

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

Pseudo * linearize_function_expr(Proc *proc,AstNode *expr)

{
  uint uVar1;
  Proc *pPVar2;
  LinearizerState *linearizer;
  C_MemoryAllocator *pCVar3;
  Proc *pPVar4;
  Pseudo *ptr;
  Pseudo *index_pseudo;
  undefined1 *ptr_00;
  Pseudo *pseudo;
  
  pPVar2 = proc->linearizer->current_proc;
  pPVar4 = allocate_proc(proc->linearizer,expr);
  linearizer = proc->linearizer;
  linearizer->current_proc = pPVar4;
  linearize_function(linearizer);
  proc->linearizer->current_proc = pPVar2;
  ptr = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
  pCVar3 = pPVar4->linearizer->compiler_state->allocator;
  index_pseudo = (Pseudo *)(*pCVar3->calloc)(pCVar3->arena,1,0x30);
  *(uint *)index_pseudo = *(uint *)index_pseudo & 0xfffffff0 | 6;
  (index_pseudo->field_3).proc = pPVar4;
  uVar1 = expr->line_number;
  pCVar3 = proc->linearizer->compiler_state->allocator;
  ptr_00 = (undefined1 *)(*pCVar3->calloc)(pCVar3->arena,1,0x28);
  *ptr_00 = 0x2a;
  *(uint *)(ptr_00 + 0x20) = uVar1;
  if (((undefined1  [48])*index_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    pseudo = indexed_load(proc,index_pseudo);
    index_pseudo = pseudo;
  }
  else {
    pseudo = (Pseudo *)0x0;
  }
  raviX_ptrlist_add((PtrList **)(ptr_00 + 8),index_pseudo,
                    proc->linearizer->compiler_state->allocator);
  if (((undefined1  [48])*ptr & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    raviX_ptrlist_add((PtrList **)(ptr_00 + 0x10),ptr,proc->linearizer->compiler_state->allocator);
    if (*(BasicBlock **)(ptr_00 + 0x18) == proc->current_bb ||
        *(BasicBlock **)(ptr_00 + 0x18) == (BasicBlock *)0x0) {
      raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr_00,
                        proc->linearizer->compiler_state->allocator);
      *(BasicBlock **)(ptr_00 + 0x18) = proc->current_bb;
      if (pseudo != (Pseudo *)0x0) {
        free_temp_pseudo(proc,pseudo,false);
      }
      return ptr;
    }
    __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x1b1,"void add_instruction(Proc *, Instruction *)");
  }
  __assert_fail("pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
}

Assistant:

static Pseudo *linearize_function_expr(Proc *proc, AstNode *expr)
{
	Proc *curproc = proc->linearizer->current_proc;
	Proc *newproc = allocate_proc(proc->linearizer, expr);
	set_current_proc(proc->linearizer, newproc);
	linearize_function(proc->linearizer);
	set_current_proc(proc->linearizer, curproc); // restore the proc
	ravitype_t target_type = expr->function_expr.type.type_code;
	Pseudo *target = allocate_temp_pseudo(proc, target_type, true);
	Pseudo *operand = allocate_closure_pseudo(newproc);
	Instruction *insn = allocate_instruction(proc, op_closure, expr->line_number);
	Pseudo *tofree = add_instruction_operand(proc, insn, operand);
	add_instruction_target(proc, insn, target);
	add_instruction(proc, insn);
	if (tofree)
		free_temp_pseudo(proc, tofree, false);
	return target;
}